

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::~SimpleGraphicsPipelineBuilder
          (SimpleGraphicsPipelineBuilder *this)

{
  long lVar1;
  
  lVar1 = 0xa8;
  do {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)
               ((long)this->m_shaderModules + lVar1 + -8));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

~SimpleGraphicsPipelineBuilder	(void) { }